

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O1

void __thiscall SQTable::SQTable(SQTable *this,SQSharedState *ss,SQInteger nInitialSize)

{
  long lVar1;
  long nSize;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = 0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQTable_00138e70;
  lVar1 = 4;
  do {
    nSize = lVar1;
    lVar1 = nSize * 2;
  } while (nSize < nInitialSize);
  AllocNodes(this,nSize);
  this->_usednodes = 0;
  (this->super_SQDelegable)._delegate = (SQTable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._next = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._prev = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQTable::SQTable(SQSharedState *ss,SQInteger nInitialSize)
{
    SQInteger pow2size=MINPOWER2;
    while(nInitialSize>pow2size)pow2size=pow2size<<1;
    AllocNodes(pow2size);
    _usednodes = 0;
    _delegate = NULL;
    INIT_CHAIN();
    ADD_TO_CHAIN(&_sharedstate->_gc_chain,this);
}